

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtrState<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
::deletePtr(SharedPtrState<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
            *this)

{
  SharedPtrState<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  *this_local;
  
  DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::operator()
            ((DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer> *)&this->field_0x18
             ,this->m_ptr);
  this->m_ptr = (Buffer *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}